

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O2

int sexp_maybe_block_port(sexp ctx,sexp in,int forcep)

{
  sexp psVar1;
  sexp_conflict f;
  int iVar2;
  uint __c;
  long lVar3;
  sexp_uint_t sVar4;
  int *piVar5;
  sexp psVar6;
  
  psVar6 = (in->value).type.getters;
  if (psVar6 == (sexp)0x0) {
    psVar6 = (in->value).type.slots;
    if (((ulong)psVar6 & 3) != 0) {
      return 0;
    }
    if (psVar6->tag != 0x12) {
      return 0;
    }
    lVar3 = (psVar6->value).fileno.fd;
  }
  else {
    iVar2 = fileno((FILE *)psVar6);
    lVar3 = (long)iVar2;
  }
  if (lVar3 < 0) {
    return 0;
  }
  sVar4 = (in->value).port.flags;
  if (sVar4 == 0xffffffffffffffff) {
    psVar6 = (in->value).type.getters;
    if (psVar6 == (sexp)0x0) {
      psVar6 = (in->value).type.slots;
      iVar2 = -1;
      if ((((ulong)psVar6 & 3) == 0) && (psVar6->tag == 0x12)) {
        iVar2 = (psVar6->value).promise.donep;
      }
    }
    else {
      iVar2 = fileno((FILE *)psVar6);
    }
    iVar2 = fcntl(iVar2,3);
    sVar4 = (sexp_uint_t)iVar2;
    (in->value).port.flags = sVar4;
  }
  if (((uint)sVar4 >> 0xb & 1) == 0) {
    return 0;
  }
  if (forcep == 0) {
    psVar6 = (in->value).type.setters;
    if (psVar6 != (sexp)0x0) {
      psVar1 = (in->value).type.print;
      if ((sexp)(in->value).port.size <= psVar1) {
        __c = sexp_buffered_read_char(ctx,in);
        goto LAB_001114af;
      }
      (in->value).type.print = (sexp)((long)&psVar1->tag + 1);
      __c = (uint)*(byte *)((long)&psVar1->tag + (long)&psVar6->tag);
LAB_001114bd:
      psVar1 = (in->value).type.print;
      (in->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
      (psVar6[-1].value.flonum_bits + 0x60bf)[(long)psVar1] = (char)__c;
      goto LAB_00111536;
    }
    __c = getc((FILE *)(in->value).type.getters);
LAB_001114af:
    if (__c != 0xffffffff) {
      psVar6 = (sexp)(in->value).bytecode.max_depth;
      if (psVar6 == (sexp)0x0) {
        ungetc(__c,(FILE *)(in->value).type.getters);
        goto LAB_00111536;
      }
      goto LAB_001114bd;
    }
    psVar6 = (in->value).type.getters;
    if (psVar6 == (sexp)0x0) {
      (in->value).flonum_bits[0x2e] = '\x01';
      goto LAB_00111553;
    }
    iVar2 = ferror((FILE *)psVar6);
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      if (*piVar5 == 0xb) {
        clearerr((FILE *)psVar6);
        f = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[0xc].start;
        if ((((ulong)f & 3) == 0) && ((f->tag == 0x1b || (f->tag == 0x14)))) {
          sexp_apply2(ctx,f,in,(sexp_conflict)&DAT_0000003e);
          return 1;
        }
      }
      goto LAB_00111536;
    }
    (in->value).flonum_bits[0x2e] = '\x01';
  }
  else {
LAB_00111536:
    psVar6 = (in->value).type.getters;
    (in->value).flonum_bits[0x2e] = '\x01';
    if (psVar6 == (sexp)0x0) {
LAB_00111553:
      iVar2 = -1;
      psVar6 = (in->value).type.slots;
      if ((((ulong)psVar6 & 3) == 0) && (psVar6->tag == 0x12)) {
        iVar2 = (psVar6->value).promise.donep;
      }
      goto LAB_00111566;
    }
  }
  iVar2 = fileno((FILE *)psVar6);
LAB_00111566:
  fcntl(iVar2,4,(in->value).port.flags & 0xfffffffffffff7ff);
  return 0;
}

Assistant:

int sexp_maybe_block_port (sexp ctx, sexp in, int forcep) {
  sexp f;
  int c;
  if ((sexp_port_stream(in) || sexp_filenop(sexp_port_fd(in)))
      && sexp_port_fileno(in) >= 0) {
    if (sexp_port_flags(in) == SEXP_PORT_UNKNOWN_FLAGS)
      sexp_port_flags(in) = fcntl(sexp_port_fileno(in), F_GETFL);
    if (sexp_port_flags(in) & O_NONBLOCK) {
      if (!forcep
          && (((c = sexp_read_char(ctx, in)) == EOF)
              && sexp_port_stream(in)
              && (sexp_port_stream(in) ? ferror(sexp_port_stream(in)) : 1)
              && (errno == EAGAIN))) {
        if (sexp_port_stream(in))
          clearerr(sexp_port_stream(in));
        f = sexp_global(ctx, SEXP_G_THREADS_BLOCKER);
        if (sexp_applicablep(f)) {
          sexp_apply2(ctx, f, in, SEXP_FALSE);
          return 1;
        }
      }
      if (!forcep) sexp_push_char(ctx, c, in);
      sexp_port_blockedp(in) = 1;
      fcntl(sexp_port_fileno(in), F_SETFL, sexp_port_flags(in) & ~O_NONBLOCK);
    }
  }
  return 0;
}